

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O0

void Lib::OutputAll<const_char_*,_unsigned_int,_const_char_*>::apply
               (ostream *out,char *m,uint ms,char *ms_1)

{
  ostream *in_RCX;
  char *in_RSI;
  ostream *in_RDI;
  uint in_stack_ffffffffffffffdc;
  
  std::operator<<(in_RDI,in_RSI);
  OutputAll<unsigned_int,_const_char_*>::apply(in_RCX,in_stack_ffffffffffffffdc,(char *)0x88cb29);
  return;
}

Assistant:

static void apply(std::ostream& out, M m, Ms... ms) {
    out << m;
    OutputAll<Ms...>::apply(out, ms...);
  }